

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.hpp
# Opt level: O3

void __thiscall defyx::JitCompilerX86::h_CFROUND(JitCompilerX86 *this,Instruction *instr,int i)

{
  uint8_t *puVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  
  puVar1 = this->code;
  iVar2 = this->codePos;
  (puVar1 + iVar2)[0] = 'I';
  (puVar1 + iVar2)[1] = 0x8b;
  iVar2 = this->codePos + 2;
  this->codePos = iVar2;
  this->code[iVar2] = instr->src + 0xc0;
  iVar2 = this->codePos;
  uVar3 = (long)iVar2 + 1;
  this->codePos = (int32_t)uVar3;
  uVar4 = 0xd - instr->imm32 & 0x3f;
  if (uVar4 != 0) {
    puVar1 = this->code;
    puVar1[(long)iVar2 + 3] = 0xc0;
    puVar1 = puVar1 + uVar3;
    puVar1[0] = 'H';
    puVar1[1] = 0xc1;
    iVar2 = this->codePos + 3;
    this->codePos = iVar2;
    this->code[iVar2] = (uint8_t)uVar4;
    uVar4 = this->codePos + 1;
    uVar3 = (ulong)uVar4;
    this->codePos = uVar4;
  }
  puVar1 = this->code + (int)uVar3;
  puVar1[0] = '%';
  puVar1[1] = '\0';
  puVar1[2] = '`';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\r';
  puVar1[6] = 0xc0;
  puVar1[7] = 0x9f;
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = 'P';
  puVar1[0xb] = '\x0f';
  puVar1[0xc] = 0xae;
  puVar1[0xd] = '\x14';
  puVar1[0xe] = '$';
  puVar1[0xf] = 'X';
  this->codePos = this->codePos + 0x10;
  return;
}

Assistant:

void emit(const uint8_t* src, size_t count) {
			memcpy(code + codePos, src, count);
			codePos += count;
		}